

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

int stbi_write_hdr_core(stbi__write_context *s,int x,int y,int comp,float *data)

{
  uint in_EDX;
  uint in_ESI;
  undefined8 *in_RDI;
  long in_R8;
  char header [66];
  char buffer [128];
  int len;
  int i;
  uchar *scratch;
  float *in_stack_fffffffffffffef8;
  uchar *in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  stbi__write_context *in_stack_ffffffffffffff10;
  char local_b8 [128];
  int local_38;
  int local_34;
  void *local_30;
  uint local_18;
  uint local_14;
  undefined8 *local_10;
  int local_4;
  
  if ((((int)in_EDX < 1) || ((int)in_ESI < 1)) || (in_R8 == 0)) {
    local_4 = 0;
  }
  else {
    local_18 = in_EDX;
    local_14 = in_ESI;
    local_10 = in_RDI;
    local_30 = malloc((long)(int)(in_ESI << 2));
    memcpy(&stack0xfffffffffffffef8,
           "#?RADIANCE\n# Written by stb_image_write.h\nFORMAT=32-bit_rle_rgbe\n",0x42);
    (*(code *)*local_10)(local_10[1],&stack0xfffffffffffffef8,0x41);
    local_38 = sprintf(local_b8,"EXPOSURE=          1.0000000000000\n\n-Y %d +X %d\n",
                       (ulong)local_18,(ulong)local_14);
    (*(code *)*local_10)(local_10[1],local_b8,local_38);
    for (local_34 = 0; local_34 < (int)local_18; local_34 = local_34 + 1) {
      stbiw__write_hdr_scanline
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08,
                 in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    }
    free(local_30);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int stbi_write_hdr_core(stbi__write_context *s, int x, int y, int comp, float *data)
{
   if (y <= 0 || x <= 0 || data == NULL)
      return 0;
   else {
      // Each component is stored separately. Allocate scratch space for full output scanline.
      unsigned char *scratch = (unsigned char *) STBIW_MALLOC(x*4);
      int i, len;
      char buffer[128];
      char header[] = "#?RADIANCE\n# Written by stb_image_write.h\nFORMAT=32-bit_rle_rgbe\n";
      s->func(s->context, header, sizeof(header)-1);

#ifdef __STDC_WANT_SECURE_LIB__
      len = sprintf_s(buffer, sizeof(buffer), "EXPOSURE=          1.0000000000000\n\n-Y %d +X %d\n", y, x);
#else
      len = sprintf(buffer, "EXPOSURE=          1.0000000000000\n\n-Y %d +X %d\n", y, x);
#endif
      s->func(s->context, buffer, len);

      for(i=0; i < y; i++)
         stbiw__write_hdr_scanline(s, x, comp, scratch, data + comp*x*(stbi__flip_vertically_on_write ? y-1-i : i));
      STBIW_FREE(scratch);
      return 1;
   }
}